

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall
ASDCP::MXF::WaveAudioDescriptor::WaveAudioDescriptor(WaveAudioDescriptor *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  UL *pUVar3;
  MDDEntry *pMVar4;
  
  GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor
            (&this->super_GenericSoundEssenceDescriptor,d);
  (this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
  super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__WaveAudioDescriptor_00225840;
  this->BlockAlign = 0;
  (this->SequenceOffset).m_has_value = false;
  this->AvgBps = 0;
  (this->ChannelAssignment).m_property.super_Identifier<16U>.m_HasValue = false;
  (this->ChannelAssignment).m_property.super_Identifier<16U>.m_Value[0] = '\0';
  (this->ChannelAssignment).m_property.super_Identifier<16U>.m_Value[1] = '\0';
  (this->ChannelAssignment).m_property.super_Identifier<16U>.m_Value[2] = '\0';
  (this->ChannelAssignment).m_property.super_Identifier<16U>.m_Value[3] = '\0';
  (this->ChannelAssignment).m_property.super_Identifier<16U>.m_Value[4] = '\0';
  (this->ChannelAssignment).m_property.super_Identifier<16U>.m_Value[5] = '\0';
  (this->ChannelAssignment).m_property.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar3 = &(this->ChannelAssignment).m_property;
  (pUVar3->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->ChannelAssignment).m_property.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->ChannelAssignment).m_property.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021f038;
  (this->ChannelAssignment).m_has_value = false;
  this_00 = (this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor
            .super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar4 = Dictionary::Type(this_00,MDD_WaveAudioDescriptor);
    uVar1 = *(undefined8 *)pMVar4->ul;
    uVar2 = *(undefined8 *)(pMVar4->ul + 8);
    *(bool *)((long)&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
                     super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_UL.
                     super_Identifier<16U> + 8) = true;
    *(undefined8 *)
     ((long)&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
             super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_UL.
             super_Identifier<16U> + 9) = uVar1;
    *(undefined8 *)
     ((long)&(this->super_GenericSoundEssenceDescriptor).super_FileDescriptor.
             super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_UL.
             super_Identifier<16U> + 0x11) = uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x658,"ASDCP::MXF::WaveAudioDescriptor::WaveAudioDescriptor(const Dictionary *)");
}

Assistant:

WaveAudioDescriptor::WaveAudioDescriptor(const Dictionary* d) : GenericSoundEssenceDescriptor(d), BlockAlign(0), AvgBps(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_WaveAudioDescriptor);
}